

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ImGuiPopupData *pIVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar2 = (GImGui->OpenPopupStack).Size;
  if ((char)popup_flags < '\0') {
    if (((uint)popup_flags >> 8 & 1) == 0) {
      uVar1 = (GImGui->BeginPopupStack).Size;
      bVar8 = SBORROW4(uVar2,uVar1);
      bVar7 = uVar2 == uVar1;
      uVar2 = uVar2 - uVar1;
    }
    else {
      bVar8 = false;
      bVar7 = uVar2 == 0;
    }
    return !bVar7 && bVar8 == (int)uVar2 < 0;
  }
  if (((uint)popup_flags >> 8 & 1) == 0) {
    iVar3 = (GImGui->BeginPopupStack).Size;
    if ((int)uVar2 <= iVar3) {
      return false;
    }
    bVar7 = (GImGui->OpenPopupStack).Data[iVar3].PopupId == id;
  }
  else {
    bVar7 = 0 < (int)uVar2;
    if ((0 < (int)uVar2) && (pIVar5 = (GImGui->OpenPopupStack).Data, pIVar5->PopupId != id)) {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        pIVar5 = pIVar5 + 1;
        if (uVar2 == uVar6) break;
        uVar4 = uVar6 + 1;
      } while (pIVar5->PopupId != id);
      return uVar6 < uVar2;
    }
  }
  return bVar7;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}